

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O0

_Bool borg_drop_junk(void)

{
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  int32_t iVar4;
  borg_item_conflict *pbVar5;
  char *pcVar6;
  borg_item *item_1;
  borg_item *item;
  int32_t local_20;
  int32_t value;
  int32_t b_p;
  int32_t p;
  int iStack_10;
  _Bool fix;
  wchar_t b_i;
  wchar_t i;
  
  p = -1;
  bVar1 = false;
  local_20 = borg.power;
  if (borg_do_crush_junk) {
    if (borg.goal.recalling == L'\0') {
      wVar3 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      if (borg.trait[0x1b] / 10 < wVar3) {
        b_i._3_1_ = false;
      }
      else {
        for (iStack_10 = 0; iStack_10 < (int)(uint)z_info->pack_size; iStack_10 = iStack_10 + 1) {
          pbVar5 = borg_items + iStack_10;
          if ((((pbVar5->iqty != '\0') && ((weapon_swap == 0 || (iStack_10 != weapon_swap + -1))))
              && ((armour_swap == 0 || (iStack_10 != armour_swap + -1)))) &&
             (((_Var2 = obj_kind_can_browse(k_info + pbVar5->kind), !_Var2 &&
               ((pbVar5->tval != '\x19' || ((pbVar5->aware & 1U) != 0)))) &&
              ((pbVar5->tval != '\n' || ((pbVar5->ident & 1U) != 0)))))) {
            item._4_4_ = pbVar5->value;
            if ((((pbVar5->tval == '\x16') || (pbVar5->tval == '\x17')) &&
                (((pbVar5->aware & 1U) != 0 ||
                 ((pbVar5->note != (char *)0x0 &&
                  (pcVar6 = strstr(pbVar5->note,"empty"), pcVar6 != (char *)0x0)))))) &&
               (pbVar5->pval < (short)(ushort)pbVar5->iqty)) {
              item._4_4_ = 0;
            }
            if ((pbVar5->tval != '\0') && (((pbVar5->ident & 1U) != 0 || (item._4_4_ < 1)))) {
              if ((((0 < pbVar5->modifiers[0]) ||
                   (((0 < pbVar5->modifiers[1] || (0 < pbVar5->modifiers[2])) ||
                    (0 < pbVar5->modifiers[3])))) || (0 < pbVar5->modifiers[4])) && (0 < item._4_4_)
                 ) {
                item._4_4_ = item._4_4_ + 2000;
              }
              if (((uint)pbVar5->tval == borg.trait[0x98]) && (0 < item._4_4_)) {
                item._4_4_ = item._4_4_ + 5000;
              }
              if (((pbVar5->aware & 1U) != 0) &&
                 (((((pbVar5->tval == '\x1a' && ((uint)pbVar5->sval == sv_potion_restore_mana)) &&
                    (0 < borg.trait[0x1f])) ||
                   (((pbVar5->tval == '\x1a' && ((uint)pbVar5->sval == sv_potion_healing)) ||
                    (((pbVar5->tval == '\x1a' && ((uint)pbVar5->sval == sv_potion_star_healing)) ||
                     ((pbVar5->tval == '\x1a' && ((uint)pbVar5->sval == sv_potion_life)))))))) ||
                  (((((pbVar5->tval == '\x1a' && ((uint)pbVar5->sval == sv_potion_speed)) ||
                     ((((pbVar5->tval == '\x18' && ((uint)pbVar5->sval == sv_rod_drain_life)) ||
                       ((pbVar5->tval == '\x18' && ((uint)pbVar5->sval == sv_rod_healing)))) ||
                      ((((pbVar5->tval == '\x18' && ((uint)pbVar5->sval == sv_rod_mapping)) &&
                        (borg.trait[0x19] == 0)) ||
                       ((pbVar5->tval == '\x16' && ((uint)pbVar5->sval == sv_staff_dispel_evil))))))
                     )) || (((pbVar5->tval == '\x16' && ((uint)pbVar5->sval == sv_staff_power)) ||
                            (((pbVar5->tval == '\x16' && ((uint)pbVar5->sval == sv_staff_holiness))
                             || ((((pbVar5->tval == '\x17' &&
                                   ((uint)pbVar5->sval == sv_wand_drain_life)) ||
                                  (((pbVar5->tval == '\x17' &&
                                    ((uint)pbVar5->sval == sv_wand_annihilation)) ||
                                   ((pbVar5->tval == '\x17' &&
                                    (((uint)pbVar5->sval == sv_wand_teleport_away &&
                                     (borg.trait[0x19] == 0)))))))) ||
                                 ((pbVar5->ego_idx != '\0' &&
                                  (_Var2 = borg_ego_has_random_power(e_info + pbVar5->ego_idx),
                                  _Var2)))))))))) ||
                   ((((pbVar5->tval == '\x19' && ((uint)pbVar5->sval == sv_scroll_teleport_level))
                     && (borg.trait[0xf7] < 1000)) ||
                    ((pbVar5->tval == '\x19' &&
                     ((uint)pbVar5->sval == sv_scroll_protection_from_evil)))))))))) {
                item._4_4_ = item._4_4_ + 5000;
              }
              if (pbVar5->tval == '\x06') {
                item._4_4_ = 0;
              }
              if ((((pbVar5->tval == '\x02') || (pbVar5->tval == '\x03')) ||
                  (pbVar5->tval == '\x04')) && ((uint)pbVar5->tval != borg.trait[0x98])) {
                item._4_4_ = 0;
              }
              if (((((pbVar5->value < 1) ||
                    ((((borg_cfg[9] == 0 && (9 < borg.trait[0x24])) &&
                      ((borg.trait[0x2d] <= borg_cfg[0x18] || (borg_cfg[0x18] == 0)))) ||
                     ((0x14 < borg.trait[0x24] || ((pbVar5->cursed & 1U) != 0)))))) &&
                   (((4 < borg.trait[0x69] || (item._4_4_ < 1)) &&
                    ((((9 < borg.trait[0x69] || (item._4_4_ < 0x10)) &&
                      ((0xe < borg.trait[0x69] || (item._4_4_ < 0x65)))) &&
                     ((0x1d < borg.trait[0x69] || (item._4_4_ < 0x1f5)))))))) &&
                  ((0x27 < borg.trait[0x69] || (item._4_4_ < 0x3e9)))) &&
                 ((((0x3b < borg.trait[0x69] || (item._4_4_ < 0x4b1)) &&
                   ((0x4f < borg.trait[0x69] || (item._4_4_ < 0x579)))) &&
                  ((((0x59 < borg.trait[0x69] || (item._4_4_ < 0x641)) &&
                    ((0x5e < borg.trait[0x69] || (item._4_4_ < 0x12c1)))) &&
                   ((((0x7e < borg.trait[0x69] || (item._4_4_ < 0x15e1)) &&
                     (_Var2 = borg_item_note_needs_id(pbVar5), !_Var2)) &&
                    (((((player->opts).opt[0x1e] & 1U) == 0 || (pbVar5->art_idx == '\0')) ||
                     ((pbVar5->ident & 1U) != 0)))))))))) {
                borg_items[iStack_10].iqty = borg_items[iStack_10].iqty + 0xff;
                bVar1 = true;
                borg_notice(true);
                iVar4 = borg_power();
                memcpy(borg_items + iStack_10,safe_items + iStack_10,0x388);
                if (local_20 < iVar4) {
                  p = iStack_10;
                  local_20 = iVar4;
                }
              }
            }
          }
        }
        if (p == -1) {
          if (bVar1) {
            borg_notice(true);
          }
          borg_do_crush_junk = false;
          b_i._3_1_ = false;
        }
        else {
          pbVar5 = borg_items + p;
          pcVar6 = format("# Dropping junk %s (valued at %ld)",pbVar5,(long)item._4_4_);
          borg_note(pcVar6);
          borg_keypress(0x7b);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[p]);
          borg_keypresses("borg ignore");
          borg_keypress(0x9c);
          borg_keypress(100);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[p]);
          if (1 < pbVar5->iqty) {
            borg_keypress(0x31);
            borg_keypress(0x9c);
          }
          b_i._3_1_ = true;
        }
      }
    }
    else {
      b_i._3_1_ = false;
    }
  }
  else {
    b_i._3_1_ = false;
  }
  return b_i._3_1_;
}

Assistant:

bool borg_drop_junk(void)
{
    int     i, b_i = -1;
    bool    fix = false;
    int32_t p, b_p = borg.power;
    int32_t value;

    /* Hack -- no need */
    if (!borg_do_crush_junk)
        return false;

    /* not while recalling since this is a two step process */
    /* and if the recall kicks in in the middle it confuses things */
    if (borg.goal.recalling)
        return false;

    /* No crush if even slightly dangerous */
    if (borg_danger(borg.c.y, borg.c.x, 1, true, false)
        > borg.trait[BI_CURHP] / 10)
        return false;

    /* Destroy actual "junk" items */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* dont crush the swap */
        if (weapon_swap && i == weapon_swap - 1)
            continue;
        if (armour_swap && i == armour_swap - 1)
            continue;

        /* Dont crush weapons if we are weilding a digger */
#if 0
        if (item->tval >= TV_DIGGING && item->tval <= TV_SWORD &&
            borg_items[INVEN_WIELD].tval == TV_DIGGING) continue;
#endif

        /* dont crush our spell books */
        if (obj_kind_can_browse(&k_info[item->kind]))
            continue;

        /* Do not crush unID'd Scrolls, sell them in town */
        if (item->tval == TV_SCROLL && !item->aware)
            continue;

        /* Do not crush Boots, they could be SPEED */
        if (item->tval == TV_BOOTS && !item->ident)
            continue;

        /* save the items value */
        value = item->value;

        /* Crush Stacked Wands and Staves that are empty.
         * ie. 5 Staffs of Teleportation (2 charges).
         * Only 2 charges in 5 staves means top 3 are empty.
         */
        if ((item->tval == TV_STAFF || item->tval == TV_WAND)
            && (item->aware || (item->note && strstr(item->note, "empty")))) {
            if (item->iqty > item->pval)
                value = 0L;
        }

        /* Skip non "worthless" items */
        if (item->tval >= TV_CHEST) {
            /* unknown and not worthless */
            if (!item->ident && value > 0)
                continue;

            /* skip items that are 'valuable'.  This is level dependent */
            /* try to make the borg junk +1,+1 dagger at level 40 */

            /* if the item gives a bonus to a stat, boost its value */
            if ((item->modifiers[OBJ_MOD_STR] > 0
                || item->modifiers[OBJ_MOD_INT] > 0
                || item->modifiers[OBJ_MOD_WIS] > 0
                || item->modifiers[OBJ_MOD_DEX] > 0
                || item->modifiers[OBJ_MOD_CON] > 0)
                && value > 0) {
                value += 2000L;
            }

            /* Keep some stuff */
            if (item->tval == borg.trait[BI_AMMO_TVAL] && value > 0)
            {
                value += 5000L;
            }

            if (item->aware && (((item->tval == TV_POTION
                    && item->sval == sv_potion_restore_mana)
                    && (borg.trait[BI_MAXSP] >= 1))
                || (item->tval == TV_POTION && item->sval == sv_potion_healing)
                || (item->tval == TV_POTION
                    && item->sval == sv_potion_star_healing)
                || (item->tval == TV_POTION && item->sval == sv_potion_life)
                || (item->tval == TV_POTION && item->sval == sv_potion_speed)
                || (item->tval == TV_ROD && item->sval == sv_rod_drain_life)
                || (item->tval == TV_ROD && item->sval == sv_rod_healing)
                || (item->tval == TV_ROD && item->sval == sv_rod_mapping
                    && borg.trait[BI_CLASS] == CLASS_WARRIOR)
                || (item->tval == TV_STAFF
                    && item->sval == sv_staff_dispel_evil)
                || (item->tval == TV_STAFF && item->sval == sv_staff_power)
                || (item->tval == TV_STAFF && item->sval == sv_staff_holiness)
                || (item->tval == TV_WAND && item->sval == sv_wand_drain_life)
                || (item->tval == TV_WAND && item->sval == sv_wand_annihilation)
                || (item->tval == TV_WAND && item->sval == sv_wand_teleport_away
                    && borg.trait[BI_CLASS] == CLASS_WARRIOR)
                || (item->ego_idx
                    && borg_ego_has_random_power(&e_info[item->ego_idx]))
                || (item->tval == TV_SCROLL
                    && item->sval == sv_scroll_teleport_level
                    && borg.trait[BI_ATELEPORTLVL] < 1000)
                || (item->tval == TV_SCROLL
                    && item->sval == sv_scroll_protection_from_evil)))

            {
                value += 5000L;
            }

            /* Go Ahead and crush diggers */
            if (item->tval == TV_DIGGING)
                value = 0L;

            /* Crush missiles that aren't mine */
            if (item->tval == TV_SHOT || item->tval == TV_ARROW
                || item->tval == TV_BOLT) {
                if (item->tval != borg.trait[BI_AMMO_TVAL])
                    value = 0L;
            }

            /* borg_worships_gold will sell all kinds of stuff,
             * except {cursed} is junk
             */
            if (item->value > 0
                && ((borg_cfg[BORG_WORSHIPS_GOLD]
                    || borg.trait[BI_MAXCLEVEL] < 10)
                    || ((borg_cfg[BORG_MONEY_SCUM_AMOUNT] < borg.trait[BI_GOLD])
                        && borg_cfg[BORG_MONEY_SCUM_AMOUNT] != 0))
                && borg.trait[BI_MAXCLEVEL] <= 20 && !item->cursed)
                continue;

            /* up to level 5, keep anything of any value */
            if (borg.trait[BI_CDEPTH] < 5 && value > 0)
                continue;
            /* up to level 10, keep anything of any value */
            if (borg.trait[BI_CDEPTH] < 10 && value > 15)
                continue;
            /* up to level 15, keep anything of value 100 or better */
            if (borg.trait[BI_CDEPTH] < 15 && value > 100)
                continue;
            /* up to level 30, keep anything of value 500 or better */
            if (borg.trait[BI_CDEPTH] < 30 && value > 500)
                continue;
            /* up to level 40, keep anything of value 1000 or better */
            if (borg.trait[BI_CDEPTH] < 40 && value > 1000)
                continue;
            /* up to level 60, keep anything of value 1200 or better */
            if (borg.trait[BI_CDEPTH] < 60 && value > 1200)
                continue;
            /* up to level 80, keep anything of value 1400 or better */
            if (borg.trait[BI_CDEPTH] < 80 && value > 1400)
                continue;
            /* up to level 90, keep anything of value 1600 or better */
            if (borg.trait[BI_CDEPTH] < 90 && value > 1600)
                continue;
            /* up to level 95, keep anything of value 4800 or better */
            if (borg.trait[BI_CDEPTH] < 95 && value > 4800)
                continue;
            /* below level 127, keep anything of value 2000 or better */
            if (borg.trait[BI_CDEPTH] < 127 && value > 5600)
                continue;

            /* Hack -- skip good un-id'd "artifacts" */
            if (borg_item_note_needs_id(item))
                continue;

            /* hack --  with random artifacts some are good and bad */
            /*         so check them all */
            if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
                continue;

            /* Destroy one item */
            borg_items[i].iqty -= 1;

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the inventory */
            p = borg_power();

            /* Restore the item */
            memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

            /* skip things we are using */
            if (p > b_p) {
                b_p = p;
                b_i = i;
            }

        }
    }

    /* if we found something junky, junk it */
    if ( b_i != -1) {
        borg_item *item = &borg_items[b_i];

        /* Message */
        borg_note(format("# Dropping junk %s (valued at %ld)", item->desc, (long int)value));

        /* inscribe "borg ignore". The borg crushes all items */
        /* on the floor that are inscribed this way */
        borg_keypress('{');
        borg_keypress(all_letters_nohjkl[b_i]);
        borg_keypresses("borg ignore");
        borg_keypress(KC_ENTER);

        /* drop it then ignore it */
        borg_keypress('d');
        borg_keypress(all_letters_nohjkl[b_i]);

        if (item->iqty > 1) {
            borg_keypress('1');
            borg_keypress(KC_ENTER);
        }

        /* Success */
        return true;
    }

    /* re-examine the inventory */
    if (fix)
        borg_notice(true);

    /* Hack -- no need */
    borg_do_crush_junk = false;

    /* Nothing to destroy */
    return false;
}